

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-fchmod.c
# Opt level: O0

int run_test_pipe_set_chmod(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *puVar3;
  undefined1 local_1b8 [8];
  stat stat_buf;
  int r;
  uv_loop_t *loop;
  uv_pipe_t pipe_handle;
  
  uVar2 = uv_default_loop();
  stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_init(uVar2,&loop,0);
  if (stat_buf.__glibc_reserved[2]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
            ,0x25,"r == 0");
    abort();
  }
  stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_bind(&loop,"/tmp/uv-test-sock");
  if (stat_buf.__glibc_reserved[2]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
            ,0x28,"r == 0");
    abort();
  }
  stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,1);
  if (stat_buf.__glibc_reserved[2]._4_4_ == -1) {
    puVar3 = (uv_loop_t *)uv_default_loop();
    close_loop(puVar3);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x2e,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    fprintf(_stderr,"%s\n","Insufficient privileges to alter pipe fmode");
    fflush(_stderr);
    pipe_handle.pipe_fname._4_4_ = 1;
  }
  else {
    if (stat_buf.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x31,"r == 0");
      abort();
    }
    stat64("/tmp/uv-test-sock",(stat64 *)local_1b8);
    if (((uint)stat_buf.st_nlink & 0x100) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x34,"stat_buf.st_mode & S_IRUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x20) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x35,"stat_buf.st_mode & S_IRGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 4) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x36,"stat_buf.st_mode & S_IROTH");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,2);
    if (stat_buf.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x3a,"r == 0");
      abort();
    }
    stat64("/tmp/uv-test-sock",(stat64 *)local_1b8);
    if (((uint)stat_buf.st_nlink & 0x80) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x3d,"stat_buf.st_mode & S_IWUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x10) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x3e,"stat_buf.st_mode & S_IWGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 2) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x3f,"stat_buf.st_mode & S_IWOTH");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,3);
    if (stat_buf.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x43,"r == 0");
      abort();
    }
    stat64("/tmp/uv-test-sock",(stat64 *)local_1b8);
    if (((uint)stat_buf.st_nlink & 0x100) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x46,"stat_buf.st_mode & S_IRUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x20) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x47,"stat_buf.st_mode & S_IRGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 4) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x48,"stat_buf.st_mode & S_IROTH");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x80) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x49,"stat_buf.st_mode & S_IWUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x10) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x4a,"stat_buf.st_mode & S_IWGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 2) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x4b,"stat_buf.st_mode & S_IWOTH");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(0,3);
    if (stat_buf.__glibc_reserved[2]._4_4_ != -9) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x4f,"r == UV_EBADF");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,0xbc614e);
    if (stat_buf.__glibc_reserved[2]._4_4_ != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x52,"r == UV_EINVAL");
      abort();
    }
    uv_close(&loop,0);
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,3);
    if (stat_buf.__glibc_reserved[2]._4_4_ != -9) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x56,"r == UV_EBADF");
      abort();
    }
    puVar3 = (uv_loop_t *)uv_default_loop();
    close_loop(puVar3);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
              ,0x58,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    pipe_handle.pipe_fname._4_4_ = 0;
  }
  return pipe_handle.pipe_fname._4_4_;
}

Assistant:

TEST_IMPL(pipe_set_chmod) {
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;
  int r;
#ifndef _WIN32
  struct stat stat_buf;
#endif

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  /* No easy way to test if this works, we will only make sure that the call is
   * successful. */
  r = uv_pipe_chmod(&pipe_handle, UV_READABLE);
  if (r == UV_EPERM) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("Insufficient privileges to alter pipe fmode");
  }
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE);
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(NULL, UV_WRITABLE | UV_READABLE);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_chmod(&pipe_handle, 12345678);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&pipe_handle, NULL);
  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT(r == UV_EBADF);

  MAKE_VALGRIND_HAPPY();
  return 0;
}